

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printCounts(ConsoleReporter *this,string *label,Counts *counts)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (counts->failed + counts->passed == 1) {
    poVar1 = std::operator<<(poVar1,"1 ");
    poVar1 = std::operator<<(poVar1,(string *)label);
    std::operator<<(poVar1," - ");
    poVar1 = (this->super_StreamingReporterBase).stream;
    if (counts->failed == 0) {
      pcVar2 = "passed";
    }
    else {
      pcVar2 = "failed";
    }
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)label);
    std::operator<<(poVar1,"s ");
    if (counts->passed == 0) {
      poVar1 = (this->super_StreamingReporterBase).stream;
      if (counts->failed == 2) {
        pcVar2 = "- both failed";
      }
      else {
        pcVar2 = "- all failed";
      }
    }
    else if (counts->failed == 0) {
      poVar1 = (this->super_StreamingReporterBase).stream;
      if (counts->passed == 2) {
        pcVar2 = "- both passed";
      }
      else {
        pcVar2 = "- all passed";
      }
    }
    else {
      poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"- ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar2 = " failed";
    }
  }
  std::operator<<(poVar1,pcVar2);
  return;
}

Assistant:

void printCounts( std::string const& label, Counts const& counts ) {
            if( counts.total() == 1 ) {
                stream << "1 " << label << " - ";
                if( counts.failed )
                    stream << "failed";
                else
                    stream << "passed";
            }
            else {
                stream << counts.total() << " " << label << "s ";
                if( counts.passed ) {
                    if( counts.failed )
                        stream << "- " << counts.failed << " failed";
                    else if( counts.passed == 2 )
                        stream << "- both passed";
                    else
                        stream << "- all passed";
                }
                else {
                    if( counts.failed == 2 )
                        stream << "- both failed";
                    else
                        stream << "- all failed";
                }
            }
        }